

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O2

QStringDecoder *
QStringDecoder::decoderForHtml(QStringDecoder *__return_storage_ptr__,QByteArrayView data)

{
  Encoding *pEVar1;
  char16_t in_CX;
  long in_FS_OFFSET;
  QByteArrayView data_00;
  QAnyStringView name;
  QArrayDataPointer<char> local_48;
  _Optional_payload_base<QStringConverter::Encoding> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  data_00.m_data = (storage_type *)0x0;
  data_00.m_size = (qsizetype)data.m_data;
  local_30 = (_Optional_payload_base<QStringConverter::Encoding>)
             QStringConverter::encodingForData((QStringConverter *)data.m_size,data_00,in_CX);
  if (((ulong)local_30 >> 0x20 & 1) == 0) {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
    parseHtmlMetaForEncoding((QByteArray *)&local_48,data);
    if ((undefined1 *)local_48.size == (undefined1 *)0x0) {
      (__return_storage_ptr__->super_QStringConverter).iface = QStringConverter::encodingInterfaces;
      (__return_storage_ptr__->super_QStringConverter).state.flags =
           (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)0x0;
      (__return_storage_ptr__->super_QStringConverter).state.internalState = 0;
      (__return_storage_ptr__->super_QStringConverter).state.remainingChars = 0;
      (__return_storage_ptr__->super_QStringConverter).state.invalidChars = 0;
      (__return_storage_ptr__->super_QStringConverter).state.field_4.d[0] = (void *)0x0;
      (__return_storage_ptr__->super_QStringConverter).state.field_4.d[1] = (void *)0x0;
      (__return_storage_ptr__->super_QStringConverter).state.clearFn = (ClearDataFn)0x0;
    }
    else {
      name.m_size = local_48.size;
      name.field_0.m_data = local_48.ptr;
      QStringConverter::QStringConverter
                (&__return_storage_ptr__->super_QStringConverter,name,(Flags)0x0);
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  }
  else {
    pEVar1 = std::optional<QStringConverter::Encoding>::value
                       ((optional<QStringConverter::Encoding> *)&local_30);
    (__return_storage_ptr__->super_QStringConverter).iface =
         QStringConverter::encodingInterfaces + *pEVar1;
    (__return_storage_ptr__->super_QStringConverter).state.flags =
         (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)0x0;
    (__return_storage_ptr__->super_QStringConverter).state.internalState = 0;
    (__return_storage_ptr__->super_QStringConverter).state.remainingChars = 0;
    (__return_storage_ptr__->super_QStringConverter).state.invalidChars = 0;
    (__return_storage_ptr__->super_QStringConverter).state.field_4.d[0] = (void *)0x0;
    (__return_storage_ptr__->super_QStringConverter).state.field_4.d[1] = (void *)0x0;
    (__return_storage_ptr__->super_QStringConverter).state.clearFn = (ClearDataFn)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringDecoder QStringDecoder::decoderForHtml(QByteArrayView data)
{
    // determine charset
    std::optional<QStringConverter::Encoding> encoding = encodingForData(data);
    if (encoding)
        // trust the initial BOM
        return QStringDecoder(encoding.value());

    QByteArray encodingTag = parseHtmlMetaForEncoding(data);
    if (!encodingTag.isEmpty())
        return QStringDecoder(encodingTag);

    return QStringDecoder(Utf8);
}